

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_str_free(nk_str *str)

{
  if (str != (nk_str *)0x0) {
    nk_buffer_free(&str->buffer);
    str->len = 0;
    return;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1c53,"void nk_str_free(struct nk_str *)");
}

Assistant:

NK_API void
nk_str_free(struct nk_str *str)
{
    NK_ASSERT(str);
    nk_buffer_free(&str->buffer);
    str->len = 0;
}